

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_sync.c
# Opt level: O0

int pt_sync_forward(uint8_t **sync,uint8_t *pos,pt_config *config)

{
  uint8_t *end_00;
  int iVar1;
  pt_config *ppVar2;
  uint8_t *puVar3;
  uint64_t val;
  uint8_t *current;
  uint8_t *start;
  uint8_t *end;
  uint8_t *begin;
  pt_config *config_local;
  uint8_t *pos_local;
  uint8_t **sync_local;
  
  if (((sync == (uint8_t **)0x0) || (pos == (uint8_t *)0x0)) || (config == (pt_config *)0x0)) {
    sync_local._4_4_ = -1;
  }
  else {
    end_00 = config->end;
    iVar1 = pt_sync_within_bounds(pos,config->begin,end_00);
    if (iVar1 == 0) {
      sync_local._4_4_ = -1;
    }
    else {
      ppVar2 = (pt_config *)align(pos,8);
      do {
        config_local = ppVar2;
        ppVar2 = (pt_config *)&config_local->begin;
        if (end_00 < ppVar2) {
          return -7;
        }
      } while (((config_local->size != 0x282028202820282) &&
               (config_local->size != 0x8202820282028202)) ||
              ((puVar3 = pt_find_psb((uint8_t *)config_local,config), puVar3 == (uint8_t *)0x0 ||
               (puVar3 < pos))));
      *sync = puVar3;
      sync_local._4_4_ = 0;
    }
  }
  return sync_local._4_4_;
}

Assistant:

int pt_sync_forward(const uint8_t **sync, const uint8_t *pos,
		    const struct pt_config *config)
{
	const uint8_t *begin, *end, *start;

	if (!sync || !pos || !config)
		return -pte_internal;

	start = pos;
	begin = config->begin;
	end = config->end;

	if (!pt_sync_within_bounds(pos, begin, end))
		return -pte_internal;

	/* We search for a full 64bit word. It's OK to skip the current one. */
	pos = align(pos, sizeof(*psb_pattern));

	/* Search for the psb payload pattern in the buffer. */
	for (;;) {
		const uint8_t *current = pos;
		uint64_t val;

		pos += sizeof(uint64_t);
		if (end < pos)
			return -pte_eos;

		val = * (const uint64_t *) current;

		if ((val != psb_pattern[0]) && (val != psb_pattern[1]))
			continue;

		/* We found a 64bit word's worth of psb payload pattern. */
		current = pt_find_psb(current, config);
		if (!current)
			continue;

		/* If @start points inside a PSB, we may find that one.  Ignore
		 * it unless @start points to its beginning.
		 */
		if (current < start)
			continue;

		*sync = current;
		return 0;
	}
}